

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzD.cpp
# Opt level: O3

void __thiscall chrono::fea::ChNodeFEAxyzD::ArchiveIN(ChNodeFEAxyzD *this)

{
  ChArchiveIn *in_RSI;
  
  ArchiveIN((ChNodeFEAxyzD *)(this[-1].D_dtdt.m_data + 2),in_RSI);
  return;
}

Assistant:

void ChNodeFEAxyzD::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChNodeFEAxyzD>();
    // deserialize parent class
    ChNodeFEAxyz::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(D);
    marchive >> CHNVP(D_dt);
    marchive >> CHNVP(D_dtdt);
}